

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

bool __thiscall ON_ParseSettings::IsUnaryPlus(ON_ParseSettings *this,ON__UINT32 c)

{
  ON__UINT32 c_local;
  ON_ParseSettings *this_local;
  
  if (c == 0x2b) {
    if ((this->m_true_default_bits[1] & 0x1000) == 0) {
      return true;
    }
  }
  else if (c == 0x2795) {
    if ((this->m_true_default_bits[1] & 0x2000) == 0) {
      return true;
    }
  }
  else if (c == 0xfe0b) {
    if ((this->m_true_default_bits[1] & 0x8000) == 0) {
      return true;
    }
  }
  else if ((c == 0xfe62) && ((this->m_true_default_bits[1] & 0x4000) == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool ON_ParseSettings::IsUnaryPlus(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x002B: // plus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_plus_as_unary_plus) )
      return true;
    break;

  case 0x2795: // heavy plus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_heavy_plus_as_unary_plus) )
      return true;
    break;

  case 0xFE62: // small plus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_small_plus_as_unary_plus) )
      return true;
    break;

  case 0xFE0B: // fullwidth plus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_fullwidth_plus_as_unary_plus) )
      return true;
    break;
  }
  return false;
}